

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unames.cpp
# Opt level: O2

uint16_t icu_63::expandName(UCharNames *names,uint8_t *name,uint16_t nameLength,
                           UCharNameChoice nameChoice,char *buffer,uint16_t bufferLength)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  uint16_t uVar4;
  UCharNameChoice UVar5;
  uint16_t uVar6;
  ushort uVar7;
  byte *pbVar8;
  bool bVar9;
  
  uVar2 = (ushort)names[1].tokenStringOffset;
  uVar3 = names->tokenStringOffset;
  if ((nameChoice & ~U_EXTENDED_CHAR_NAME) != U_UNICODE_CHAR_NAME) {
    UVar5 = nameChoice;
    if ((uVar2 < 0x3c) || ((short)names[8].groupStringOffset == -1)) {
      do {
        uVar6 = nameLength;
        if (nameLength == 0) {
          nameLength = 0;
        }
        else {
          do {
            nameLength = uVar6 - 1;
            bVar1 = *name;
            name = name + 1;
            if (bVar1 == 0x3b) break;
            bVar9 = uVar6 != 1;
            uVar6 = nameLength;
          } while (bVar9);
        }
        bVar9 = 1 < (int)UVar5;
        UVar5 = UVar5 - U_UNICODE_10_CHAR_NAME;
      } while (bVar9);
    }
    else {
      nameLength = 0;
    }
  }
  uVar6 = 0;
  while (nameLength != 0) {
    pbVar8 = name + 1;
    bVar1 = *name;
    if (bVar1 < uVar2) {
      uVar7 = *(ushort *)((long)&names[1].tokenStringOffset + (ulong)(ushort)bVar1 * 2 + 2);
      uVar4 = nameLength - 1;
      if (uVar7 == 0xfffe) {
        pbVar8 = name + 2;
        uVar7 = *(ushort *)
                 ((long)&names[1].tokenStringOffset +
                 (ulong)((uint)(ushort)bVar1 * 0x200 + (uint)name[1] * 2) + 2);
        uVar4 = nameLength - 2;
      }
      nameLength = uVar4;
      name = pbVar8;
      if (uVar7 == 0xffff) {
        if (bVar1 != 0x3b) goto LAB_0033ed25;
        if (((nameChoice != U_EXTENDED_CHAR_NAME) || (uVar6 != 0)) ||
           (uVar6 = 0, (short)names[8].groupStringOffset != -1)) break;
      }
      else {
        pbVar8 = (byte *)((long)&names->tokenStringOffset + (ulong)uVar7 + (ulong)uVar3);
        while( true ) {
          bVar1 = *pbVar8;
          pbVar8 = pbVar8 + 1;
          if (bVar1 == 0) break;
          if (bufferLength == 0) {
            bufferLength = 0;
          }
          else {
            *buffer = bVar1;
            buffer = (char *)((byte *)buffer + 1);
            bufferLength = bufferLength - 1;
          }
          uVar6 = uVar6 + 1;
        }
      }
    }
    else {
      nameLength = nameLength - 1;
      if (bVar1 == 0x3b) break;
LAB_0033ed25:
      if (bufferLength == 0) {
        bufferLength = 0;
      }
      else {
        *buffer = bVar1;
        buffer = (char *)((byte *)buffer + 1);
        bufferLength = bufferLength - 1;
      }
      uVar6 = uVar6 + 1;
      name = pbVar8;
    }
  }
  if (bufferLength != 0) {
    *buffer = 0;
  }
  return uVar6;
}

Assistant:

static uint16_t
expandName(UCharNames *names,
           const uint8_t *name, uint16_t nameLength, UCharNameChoice nameChoice,
           char *buffer, uint16_t bufferLength) {
    uint16_t *tokens=(uint16_t *)names+8;
    uint16_t token, tokenCount=*tokens++, bufferPos=0;
    uint8_t *tokenStrings=(uint8_t *)names+names->tokenStringOffset;
    uint8_t c;

    if(nameChoice!=U_UNICODE_CHAR_NAME && nameChoice!=U_EXTENDED_CHAR_NAME) {
        /*
         * skip the modern name if it is not requested _and_
         * if the semicolon byte value is a character, not a token number
         */
        if((uint8_t)';'>=tokenCount || tokens[(uint8_t)';']==(uint16_t)(-1)) {
            int fieldIndex= nameChoice==U_ISO_COMMENT ? 2 : nameChoice;
            do {
                while(nameLength>0) {
                    --nameLength;
                    if(*name++==';') {
                        break;
                    }
                }
            } while(--fieldIndex>0);
        } else {
            /*
             * the semicolon byte value is a token number, therefore
             * only modern names are stored in unames.dat and there is no
             * such requested alternate name here
             */
            nameLength=0;
        }
    }

    /* write each letter directly, and write a token word per token */
    while(nameLength>0) {
        --nameLength;
        c=*name++;

        if(c>=tokenCount) {
            if(c!=';') {
                /* implicit letter */
                WRITE_CHAR(buffer, bufferLength, bufferPos, c);
            } else {
                /* finished */
                break;
            }
        } else {
            token=tokens[c];
            if(token==(uint16_t)(-2)) {
                /* this is a lead byte for a double-byte token */
                token=tokens[c<<8|*name++];
                --nameLength;
            }
            if(token==(uint16_t)(-1)) {
                if(c!=';') {
                    /* explicit letter */
                    WRITE_CHAR(buffer, bufferLength, bufferPos, c);
                } else {
                    /* stop, but skip the semicolon if we are seeking
                       extended names and there was no 2.0 name but there
                       is a 1.0 name. */
                    if(!bufferPos && nameChoice == U_EXTENDED_CHAR_NAME) {
                        if ((uint8_t)';'>=tokenCount || tokens[(uint8_t)';']==(uint16_t)(-1)) {
                            continue;
                        }
                    }
                    /* finished */
                    break;
                }
            } else {
                /* write token word */
                uint8_t *tokenString=tokenStrings+token;
                while((c=*tokenString++)!=0) {
                    WRITE_CHAR(buffer, bufferLength, bufferPos, c);
                }
            }
        }
    }

    /* zero-terminate */
    if(bufferLength>0) {
        *buffer=0;
    }

    return bufferPos;
}